

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void dumpULong(uint64_t value,bool inArray)

{
  int i;
  int iVar1;
  
  for (iVar1 = 0x38; -1 < iVar1; iVar1 = iVar1 + -8) {
    printf("%02hhx ",value >> ((byte)iVar1 & 0x3f) & 0xff);
  }
  if (inArray) {
    putchar(0x20);
    return;
  }
  return;
}

Assistant:

void dumpULong(uint64_t value, bool inArray = false)
{
	for (int i = 56; i >= 0; i -= 8)
	{
		uint8_t v;
		v = (value >> i) & 0xff;
		printf("%02hhx ", v);
	}
	if (inArray)
	{
		printf(" ");
	}
}